

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::MergeFromImpl<true>
          (internal *this,StringPiece input,MessageLite *msg,ParseFlags parse_flags)

{
  bool bVar1;
  ParseContext *ctx_00;
  undefined1 auVar2 [12];
  char *ptr;
  StringPiece input_local;
  ParseContext ctx;
  
  ctx_00 = (ParseContext *)input.length_;
  input_local.length_ = (size_type)input.ptr_;
  input_local.ptr_ = (char *)this;
  ParseContext::ParseContext<google::protobuf::stringpiece_internal::StringPiece&>
            (&ctx,io::CodedInputStream::default_recursion_limit_,true,&ptr,&input_local);
  auVar2 = (**(code **)((ctx_00->super_EpsCopyInputStream).limit_end_ + 0x50))(ctx_00,ptr,&ctx);
  ptr = auVar2._0_8_;
  bVar1 = false;
  if ((ptr != (char *)0x0) && (bVar1 = false, ctx.super_EpsCopyInputStream.last_tag_minus_1_ == 0))
  {
    bVar1 = anon_unknown_13::CheckFieldPresence
                      (ctx_00,(MessageLite *)((ulong)msg & 0xffffffff),auVar2._8_4_);
  }
  return bVar1;
}

Assistant:

bool MergeFromImpl(StringPiece input, MessageLite* msg,
                   MessageLite::ParseFlags parse_flags) {
  const char* ptr;
  internal::ParseContext ctx(io::CodedInputStream::GetDefaultRecursionLimit(),
                             aliasing, &ptr, input);
  ptr = msg->_InternalParse(ptr, &ctx);
  // ctx has an explicit limit set (length of string_view).
  if (PROTOBUF_PREDICT_TRUE(ptr && ctx.EndedAtLimit())) {
    return CheckFieldPresence(ctx, *msg, parse_flags);
  }
  return false;
}